

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  u16 uVar1;
  uint uVar2;
  uint uVar3;
  sqlite3_io_methods *psVar4;
  u32 *puVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint *__s;
  ht_slot *phVar14;
  uint uVar15;
  ulong uVar16;
  short sVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  ushort *puVar22;
  uint uVar23;
  uint uVar24;
  u32 *aContent;
  ulong uVar25;
  uint *puVar26;
  undefined1 auVar27 [16];
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  int iVar50;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar53 [16];
  int isChanged;
  int nList;
  i64 nSize;
  i64 nReq;
  uint local_1ac;
  ht_slot *local_1a8;
  _func_int_void_ptr *local_1a0;
  size_t local_198;
  uint local_18c;
  ht_slot *local_188;
  int local_17c;
  void *local_178;
  long local_170;
  ulong local_168;
  uint local_15c;
  ulong local_158;
  uint *local_150;
  ulong local_148;
  ulong local_140;
  WalHashLoc local_138;
  long local_120;
  long local_118;
  sqlite3 *local_110;
  long local_108;
  uint local_100 [52];
  long lVar30;
  
  local_17c = 0;
  if (pWal->readOnly != '\0') {
    return 8;
  }
  local_178 = pBusyArg;
  if ((pWal->exclusiveMode == '\0') &&
     (iVar12 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,10), iVar12 != 0)) {
    return iVar12;
  }
  pWal->ckptLock = '\x01';
  local_110 = db;
  if (eMode != 0) {
    do {
      iVar12 = eMode;
      if (pWal->exclusiveMode != '\0') {
LAB_0013a30c:
        pWal->writeLock = '\x01';
        goto LAB_0013a31c;
      }
      iVar11 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10);
      if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar11 != 5)) {
        if (iVar11 != 5) {
          if (iVar11 == 0) goto LAB_0013a30c;
          goto LAB_0013a34a;
        }
        break;
      }
      iVar12 = (*xBusy)(local_178);
    } while (iVar12 != 0);
    xBusy = (_func_int_void_ptr *)0x0;
  }
  iVar12 = 0;
LAB_0013a31c:
  iVar11 = walIndexReadHdr(pWal,&local_17c);
  if (local_17c != 0) {
    psVar4 = pWal->pDbFd->pMethods;
    if (2 < psVar4->iVersion) {
      (*psVar4->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
    }
  }
LAB_0013a34a:
  if (iVar11 != 0) goto LAB_0013a6db;
  uVar18 = (pWal->hdr).mxFrame;
  uVar1 = (pWal->hdr).szPage;
  uVar15 = CONCAT22(uVar1,uVar1) & 0x1fe00;
  if ((uVar18 != 0) && (uVar15 != nBuf)) {
    iVar11 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf1f3,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    goto LAB_0013a6db;
  }
  puVar5 = *pWal->apWiData;
  if (puVar5[0x18] < uVar18) {
    local_148 = (ulong)(pWal->hdr).nPage;
    iVar11 = 0;
    lVar21 = 1;
    local_18c = uVar15;
    do {
      uVar15 = puVar5[lVar21 + 0x19];
      if (uVar15 < uVar18) {
        iVar19 = (int)lVar21 + 3;
        do {
          if (pWal->exclusiveMode != '\0') {
LAB_0013a447:
            uVar15 = 0xffffffff;
            if (lVar21 == 1) {
              uVar15 = uVar18;
            }
            puVar5[lVar21 + 0x19] = uVar15;
            iVar11 = 0;
            if (pWal->exclusiveMode == '\0') {
              (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar19,1,9);
            }
            goto LAB_0013a499;
          }
          iVar11 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar19,1,10);
          if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar11 != 5)) {
            if (iVar11 == 5) goto LAB_0013a46d;
            if (iVar11 == 0) goto LAB_0013a447;
            __s = (uint *)0x0;
            goto LAB_0013a69c;
          }
          iVar11 = (*xBusy)(local_178);
        } while (iVar11 != 0);
        iVar11 = 5;
LAB_0013a46d:
        xBusy = (_func_int_void_ptr *)0x0;
        uVar18 = uVar15;
      }
LAB_0013a499:
      lVar21 = lVar21 + 1;
    } while (lVar21 != 5);
    if (uVar18 <= puVar5[0x18]) {
      __s = (uint *)0x0;
      goto LAB_0013a508;
    }
    local_1a8 = (ht_slot *)(ulong)puVar5[0x18];
    uVar15 = (pWal->hdr).mxFrame;
    iVar11 = sqlite3_initialize();
    if (iVar11 == 0) {
      uVar25 = (ulong)(uVar15 + 0x1000) + 0xffffffff021 >> 0xc;
      local_170 = uVar25 << 0x20;
      local_198 = (local_170 >> 0x1b) + (ulong)uVar15 * 2 + 0x28;
      __s = (uint *)sqlite3Malloc(local_198);
      if (__s != (uint *)0x0) {
        iVar19 = (int)uVar25;
        local_158 = (ulong)uVar15;
        memset(__s,0,local_198);
        __s[1] = iVar19 + 1;
        iVar13 = sqlite3_initialize();
        iVar11 = 7;
        if (iVar13 != 0) {
LAB_0013a629:
          sqlite3_free(__s);
          __s = (uint *)0x0;
          goto LAB_0013a508;
        }
        uVar15 = 0x1000;
        if ((uint)local_158 < 0x1000) {
          uVar15 = (uint)local_158;
        }
        phVar14 = (ht_slot *)sqlite3Malloc((ulong)(uVar15 * 2));
        local_1a0 = xBusy;
        if ((phVar14 == (ht_slot *)0x0) ||
           (iVar13 = (int)((ulong)((int)local_1a8 + 0x1001) + 0xffffffff021 >> 0xc), iVar19 < iVar13
           )) {
          sqlite3_free(phVar14);
          if (phVar14 == (ht_slot *)0x0) goto LAB_0013a629;
        }
        else {
          local_150 = __s + 2;
          lVar21 = (long)iVar13;
          local_170 = local_170 >> 0x20;
          local_120 = (long)__s + 0x16;
          local_1a8 = phVar14;
          do {
            iVar11 = walHashGet(pWal,(int)lVar21,&local_138);
            auVar9 = _DAT_001d5060;
            if (iVar11 != 0) {
              sqlite3_free(local_1a8);
              goto LAB_0013a629;
            }
            aContent = local_138.aPgno + 1;
            if (lVar21 == local_170) {
              local_140 = (ulong)((int)local_158 - local_138.iZero);
            }
            else {
              local_140 = (ulong)((long)local_138.aHash - (long)aContent) >> 2;
            }
            local_198 = (long)local_150 + (ulong)local_138.iZero * 2 + (long)(int)__s[1] * 0x20;
            local_15c = local_138.iZero + 1;
            local_138.aPgno = aContent;
            local_118 = lVar21;
            if ((int)local_140 < 1) {
              local_1ac = 0;
              local_188 = (ht_slot *)0x0;
              local_138.iZero = local_15c;
              memset(&local_108,0,0xd0);
              uVar15 = 1;
LAB_0013ac0b:
              uVar16 = (ulong)uVar15;
              puVar26 = local_100 + uVar16 * 4;
              uVar25 = local_140;
              do {
                if (((uint)uVar25 >> ((uint)uVar16 & 0x1f) & 1) != 0) {
                  walMerge(aContent,*(ht_slot **)puVar26,puVar26[-2],&local_188,(int *)&local_1ac,
                           local_1a8);
                  uVar25 = local_140;
                }
                uVar16 = uVar16 + 1;
                puVar26 = puVar26 + 4;
              } while ((int)uVar16 != 0xd);
            }
            else {
              local_168 = local_140 & 0xffffffff;
              lVar21 = local_168 - 1;
              auVar27._8_4_ = (int)lVar21;
              auVar27._0_8_ = lVar21;
              auVar27._12_4_ = (int)((ulong)lVar21 >> 0x20);
              lVar21 = (long)(int)__s[1] * 0x20 + (ulong)local_138.iZero * 2 + local_120;
              auVar27 = auVar27 ^ _DAT_001d5060;
              uVar25 = 0;
              auVar29 = _DAT_001df1f0;
              auVar31 = _DAT_001df1e0;
              auVar32 = _DAT_001df1d0;
              auVar33 = _DAT_001df1c0;
              do {
                auVar34 = auVar29 ^ auVar9;
                iVar11 = auVar27._0_4_;
                iVar47 = -(uint)(iVar11 < auVar34._0_4_);
                iVar19 = auVar27._4_4_;
                auVar35._4_4_ = -(uint)(iVar19 < auVar34._4_4_);
                iVar13 = auVar27._8_4_;
                iVar50 = -(uint)(iVar13 < auVar34._8_4_);
                iVar28 = auVar27._12_4_;
                auVar35._12_4_ = -(uint)(iVar28 < auVar34._12_4_);
                auVar44._4_4_ = iVar47;
                auVar44._0_4_ = iVar47;
                auVar44._8_4_ = iVar50;
                auVar44._12_4_ = iVar50;
                auVar51 = pshuflw(in_XMM8,auVar44,0xe8);
                auVar37._4_4_ = -(uint)(auVar34._4_4_ == iVar19);
                auVar37._12_4_ = -(uint)(auVar34._12_4_ == iVar28);
                auVar37._0_4_ = auVar37._4_4_;
                auVar37._8_4_ = auVar37._12_4_;
                auVar53 = pshuflw(in_XMM9,auVar37,0xe8);
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar52 = pshuflw(auVar51,auVar35,0xe8);
                auVar34._8_4_ = 0xffffffff;
                auVar34._0_8_ = 0xffffffffffffffff;
                auVar34._12_4_ = 0xffffffff;
                auVar34 = (auVar52 | auVar53 & auVar51) ^ auVar34;
                auVar34 = packssdw(auVar34,auVar34);
                sVar17 = (short)uVar25;
                if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(short *)(lVar21 + -0xe + uVar25 * 2) = sVar17;
                }
                auVar35 = auVar37 & auVar44 | auVar35;
                auVar34 = packssdw(auVar35,auVar35);
                auVar52._8_4_ = 0xffffffff;
                auVar52._0_8_ = 0xffffffffffffffff;
                auVar52._12_4_ = 0xffffffff;
                auVar34 = packssdw(auVar34 ^ auVar52,auVar34 ^ auVar52);
                if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
                  *(short *)(lVar21 + -0xc + uVar25 * 2) = sVar17 + 1;
                }
                auVar34 = auVar31 ^ auVar9;
                iVar47 = -(uint)(iVar11 < auVar34._0_4_);
                auVar48._4_4_ = -(uint)(iVar19 < auVar34._4_4_);
                iVar50 = -(uint)(iVar13 < auVar34._8_4_);
                auVar48._12_4_ = -(uint)(iVar28 < auVar34._12_4_);
                auVar36._4_4_ = iVar47;
                auVar36._0_4_ = iVar47;
                auVar36._8_4_ = iVar50;
                auVar36._12_4_ = iVar50;
                auVar43._4_4_ = -(uint)(auVar34._4_4_ == iVar19);
                auVar43._12_4_ = -(uint)(auVar34._12_4_ == iVar28);
                auVar43._0_4_ = auVar43._4_4_;
                auVar43._8_4_ = auVar43._12_4_;
                auVar48._0_4_ = auVar48._4_4_;
                auVar48._8_4_ = auVar48._12_4_;
                auVar34 = auVar43 & auVar36 | auVar48;
                auVar34 = packssdw(auVar34,auVar34);
                auVar7._8_4_ = 0xffffffff;
                auVar7._0_8_ = 0xffffffffffffffff;
                auVar7._12_4_ = 0xffffffff;
                auVar34 = packssdw(auVar34 ^ auVar7,auVar34 ^ auVar7);
                if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(short *)(lVar21 + -10 + uVar25 * 2) = sVar17 + 2;
                }
                auVar37 = pshufhw(auVar36,auVar36,0x84);
                auVar44 = pshufhw(auVar43,auVar43,0x84);
                auVar35 = pshufhw(auVar37,auVar48,0x84);
                auVar38._8_4_ = 0xffffffff;
                auVar38._0_8_ = 0xffffffffffffffff;
                auVar38._12_4_ = 0xffffffff;
                auVar38 = (auVar35 | auVar44 & auVar37) ^ auVar38;
                auVar37 = packssdw(auVar38,auVar38);
                if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(short *)(lVar21 + -8 + uVar25 * 2) = sVar17 + 3;
                }
                auVar37 = auVar32 ^ auVar9;
                iVar47 = -(uint)(iVar11 < auVar37._0_4_);
                auVar40._4_4_ = -(uint)(iVar19 < auVar37._4_4_);
                iVar50 = -(uint)(iVar13 < auVar37._8_4_);
                auVar40._12_4_ = -(uint)(iVar28 < auVar37._12_4_);
                auVar45._4_4_ = iVar47;
                auVar45._0_4_ = iVar47;
                auVar45._8_4_ = iVar50;
                auVar45._12_4_ = iVar50;
                auVar34 = pshuflw(auVar34,auVar45,0xe8);
                auVar39._4_4_ = -(uint)(auVar37._4_4_ == iVar19);
                auVar39._12_4_ = -(uint)(auVar37._12_4_ == iVar28);
                auVar39._0_4_ = auVar39._4_4_;
                auVar39._8_4_ = auVar39._12_4_;
                in_XMM9 = pshuflw(auVar53 & auVar51,auVar39,0xe8);
                in_XMM9 = in_XMM9 & auVar34;
                auVar40._0_4_ = auVar40._4_4_;
                auVar40._8_4_ = auVar40._12_4_;
                auVar34 = pshuflw(auVar34,auVar40,0xe8);
                auVar51._8_4_ = 0xffffffff;
                auVar51._0_8_ = 0xffffffffffffffff;
                auVar51._12_4_ = 0xffffffff;
                auVar51 = (auVar34 | in_XMM9) ^ auVar51;
                auVar34 = packssdw(auVar51,auVar51);
                if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(short *)(lVar21 + -6 + uVar25 * 2) = sVar17 + 4;
                }
                auVar40 = auVar39 & auVar45 | auVar40;
                auVar34 = packssdw(auVar40,auVar40);
                auVar53._8_4_ = 0xffffffff;
                auVar53._0_8_ = 0xffffffffffffffff;
                auVar53._12_4_ = 0xffffffff;
                auVar34 = packssdw(auVar34 ^ auVar53,auVar34 ^ auVar53);
                if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(short *)(lVar21 + -4 + uVar25 * 2) = sVar17 + 5;
                }
                auVar34 = auVar33 ^ auVar9;
                iVar11 = -(uint)(iVar11 < auVar34._0_4_);
                auVar49._4_4_ = -(uint)(iVar19 < auVar34._4_4_);
                iVar13 = -(uint)(iVar13 < auVar34._8_4_);
                auVar49._12_4_ = -(uint)(iVar28 < auVar34._12_4_);
                auVar41._4_4_ = iVar11;
                auVar41._0_4_ = iVar11;
                auVar41._8_4_ = iVar13;
                auVar41._12_4_ = iVar13;
                auVar46._4_4_ = -(uint)(auVar34._4_4_ == iVar19);
                auVar46._12_4_ = -(uint)(auVar34._12_4_ == iVar28);
                auVar46._0_4_ = auVar46._4_4_;
                auVar46._8_4_ = auVar46._12_4_;
                auVar49._0_4_ = auVar49._4_4_;
                auVar49._8_4_ = auVar49._12_4_;
                auVar34 = auVar46 & auVar41 | auVar49;
                auVar34 = packssdw(auVar34,auVar34);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar34 ^ auVar8,auVar34 ^ auVar8);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(short *)(lVar21 + -2 + uVar25 * 2) = sVar17 + 6;
                }
                auVar34 = pshufhw(auVar41,auVar41,0x84);
                auVar35 = pshufhw(auVar46,auVar46,0x84);
                auVar37 = pshufhw(auVar34,auVar49,0x84);
                auVar42._8_4_ = 0xffffffff;
                auVar42._0_8_ = 0xffffffffffffffff;
                auVar42._12_4_ = 0xffffffff;
                auVar42 = (auVar37 | auVar35 & auVar34) ^ auVar42;
                auVar34 = packssdw(auVar42,auVar42);
                if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(short *)(lVar21 + uVar25 * 2) = sVar17 + 7;
                }
                uVar25 = uVar25 + 8;
                lVar30 = auVar29._8_8_;
                auVar29._0_8_ = auVar29._0_8_ + 8;
                auVar29._8_8_ = lVar30 + 8;
                lVar30 = auVar31._8_8_;
                auVar31._0_8_ = auVar31._0_8_ + 8;
                auVar31._8_8_ = lVar30 + 8;
                lVar30 = auVar32._8_8_;
                auVar32._0_8_ = auVar32._0_8_ + 8;
                auVar32._8_8_ = lVar30 + 8;
                lVar30 = auVar33._8_8_;
                auVar33._0_8_ = auVar33._0_8_ + 8;
                auVar33._8_8_ = lVar30 + 8;
              } while (((int)local_140 + 7U & 0xfffffff8) != uVar25);
              local_138.iZero = local_15c;
              memset(&local_108,0,0xd0);
              uVar25 = 0;
              do {
                phVar14 = local_1a8;
                local_1ac = 1;
                local_188 = (ht_slot *)(local_198 + uVar25 * 2);
                uVar15 = 0;
                if ((uVar25 & 1) != 0) {
                  do {
                    walMerge(aContent,*(ht_slot **)(local_100 + (ulong)uVar15 * 4),
                             local_100[((ulong)uVar15 * 2 + -1) * 2],&local_188,(int *)&local_1ac,
                             phVar14);
                    uVar15 = uVar15 + 1;
                    xBusy = local_1a0;
                  } while (((uint)uVar25 >> (uVar15 & 0x1f) & 1) != 0);
                }
                *(ht_slot **)(local_100 + (ulong)uVar15 * 4) = local_188;
                local_100[((ulong)uVar15 * 2 + -1) * 2] = local_1ac;
                uVar25 = uVar25 + 1;
              } while (uVar25 != local_168);
              uVar15 = uVar15 + 1;
              if (uVar15 < 0xd) goto LAB_0013ac0b;
            }
            local_150[local_118 * 8 + 7] = local_15c;
            local_150[local_118 * 8 + 6] = local_1ac;
            *(size_t *)(local_150 + local_118 * 8 + 2) = local_198;
            *(u32 **)(local_150 + local_118 * 8 + 4) = aContent;
            lVar21 = local_118 + 1;
          } while (local_118 < local_170);
          sqlite3_free(local_1a8);
        }
        do {
          if (pWal->exclusiveMode != '\0') {
LAB_0013ad49:
            local_1a8 = (ht_slot *)CONCAT44(local_1a8._4_4_,puVar5[0x18]);
            puVar5[0x20] = uVar18;
            uVar15 = (uint)sync_flags >> 2 & 3;
            if ((uVar15 != 0) &&
               (iVar11 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar15), iVar11 != 0))
            goto LAB_0013afa7;
            local_198 = (size_t)local_18c;
            local_108 = local_148 * local_198;
            iVar11 = (*pWal->pDbFd->pMethods->xFileSize)(pWal->pDbFd,(sqlite3_int64 *)&local_138);
            if (iVar11 != 0) goto LAB_0013afa7;
            if ((long)local_138.aHash < local_108) {
              psVar4 = pWal->pDbFd->pMethods;
              if (psVar4 != (sqlite3_io_methods *)0x0) {
                (*psVar4->xFileControl)(pWal->pDbFd,5,&local_108);
              }
            }
            uVar23 = __s[1];
            if ((int)uVar23 < 1) goto LAB_0013af23;
            local_168 = (ulong)(local_18c | 0x18);
            uVar24 = 0;
            goto LAB_0013ae0e;
          }
          iVar11 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,10);
          if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar11 != 5)) {
            if (iVar11 == 0) goto LAB_0013ad49;
            goto LAB_0013a508;
          }
          iVar11 = (*xBusy)(local_178);
          iVar19 = 0;
        } while (iVar11 != 0);
        goto LAB_0013a513;
      }
    }
    sqlite3_free((void *)0x0);
    iVar11 = 7;
    goto LAB_0013a6db;
  }
  __s = (uint *)0x0;
  iVar19 = 0;
  goto LAB_0013a513;
  while( true ) {
    if (((((uint)local_1a8 < uVar24) && (uVar24 <= uVar18)) && (uVar20 <= (uint)local_148)) &&
       ((iVar11 = (*pWal->pWalFd->pMethods->xRead)
                            (pWal->pWalFd,zBuf,local_18c,(uVar24 - 1) * local_168 + 0x38),
        xBusy = local_1a0, iVar11 != 0 ||
        (iVar11 = (*pWal->pDbFd->pMethods->xWrite)(pWal->pDbFd,zBuf,uVar10,(uVar20 - 1) * local_198)
        , xBusy = local_1a0, iVar11 != 0)))) goto LAB_0013afa7;
    uVar23 = __s[1];
    if ((int)uVar23 < 1) break;
LAB_0013ae0e:
    uVar10 = local_18c;
    uVar2 = *__s;
    uVar20 = 0xffffffff;
    uVar25 = (ulong)uVar23;
    do {
      uVar16 = uVar25 - 1;
      uVar23 = __s[uVar16 * 8 + 2];
      if ((int)uVar23 < (int)__s[uVar16 * 8 + 8]) {
        puVar26 = __s + uVar16 * 8 + 2;
        puVar22 = (ushort *)((long)(int)uVar23 * 2 + *(long *)(puVar26 + 2));
        do {
          uVar23 = uVar23 + 1;
          uVar3 = *(uint *)(*(long *)(puVar26 + 4) + (ulong)*puVar22 * 4);
          if (uVar2 < uVar3) {
            if (uVar3 < uVar20) {
              uVar24 = (uint)*puVar22 + puVar26[7];
              uVar20 = uVar3;
            }
            break;
          }
          *puVar26 = uVar23;
          puVar22 = puVar22 + 1;
        } while (uVar23 != __s[uVar16 * 8 + 8]);
      }
      bVar6 = 1 < (long)uVar25;
      uVar25 = uVar16;
    } while (bVar6);
    *__s = uVar20;
    if (uVar20 == 0xffffffff) goto LAB_0013af29;
    if ((local_110->u1).isInterrupted != 0) {
      iVar11 = (uint)(local_110->mallocFailed == '\0') * 2 + 7;
      xBusy = local_1a0;
      goto LAB_0013afa7;
    }
  }
LAB_0013af23:
  *__s = 0xffffffff;
LAB_0013af29:
  if ((uVar18 != (*pWal->apWiData)[4]) ||
     ((iVar11 = (*pWal->pDbFd->pMethods->xTruncate)(pWal->pDbFd,local_198 * (pWal->hdr).nPage),
      xBusy = local_1a0, iVar11 == 0 &&
      ((uVar15 == 0 ||
       (iVar11 = (*pWal->pDbFd->pMethods->xSync)(pWal->pDbFd,uVar15), xBusy = local_1a0, iVar11 == 0
       )))))) {
    puVar5[0x18] = uVar18;
    iVar11 = 0;
    xBusy = local_1a0;
  }
LAB_0013afa7:
  if (pWal->exclusiveMode == '\0') {
    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,9);
  }
LAB_0013a508:
  iVar19 = 0;
  if (iVar11 != 5) {
    iVar19 = iVar11;
  }
LAB_0013a513:
  iVar11 = iVar19;
  if ((iVar12 == 0) || (iVar11 != 0)) {
LAB_0013a69c:
    sqlite3_free(__s);
    if ((iVar11 != 5) && (iVar11 != 0)) goto LAB_0013a6db;
  }
  else {
    iVar11 = 5;
    if (((pWal->hdr).mxFrame <= puVar5[0x18]) && (iVar11 = 0, 1 < iVar12)) {
      sqlite3_randomness(4,&local_108);
      do {
        if (pWal->exclusiveMode != '\0') {
LAB_0013a655:
          iVar11 = 0;
          if (iVar12 == 3) {
            walRestartHdr(pWal,(u32)local_108);
            iVar11 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
          }
          if (pWal->exclusiveMode == '\0') {
            (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
          }
          goto LAB_0013a69c;
        }
        iVar11 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
        if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar11 != 5)) {
          if (iVar11 == 0) goto LAB_0013a655;
          goto LAB_0013a69c;
        }
        iVar11 = (*xBusy)(local_178);
      } while (iVar11 != 0);
      iVar11 = 5;
      goto LAB_0013a69c;
    }
    sqlite3_free(__s);
  }
  if (pnLog != (int *)0x0) {
    *pnLog = (pWal->hdr).mxFrame;
  }
  if (pnCkpt != (int *)0x0) {
    *pnCkpt = (*pWal->apWiData)[0x18];
  }
LAB_0013a6db:
  if (local_17c != 0) {
    (pWal->hdr).aSalt[0] = 0;
    (pWal->hdr).aSalt[1] = 0;
    (pWal->hdr).aCksum[0] = 0;
    (pWal->hdr).aCksum[1] = 0;
    (pWal->hdr).mxFrame = 0;
    (pWal->hdr).nPage = 0;
    (pWal->hdr).aFrameCksum[0] = 0;
    (pWal->hdr).aFrameCksum[1] = 0;
    (pWal->hdr).iVersion = 0;
    (pWal->hdr).unused = 0;
    (pWal->hdr).iChange = 0;
    (pWal->hdr).isInit = '\0';
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).szPage = 0;
  }
  sqlite3WalEndWriteTransaction(pWal);
  if (pWal->exclusiveMode == '\0') {
    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,9);
  }
  iVar19 = 5;
  if (iVar11 != 0) {
    iVar19 = iVar11;
  }
  pWal->ckptLock = '\0';
  if (iVar12 == eMode) {
    iVar19 = iVar11;
  }
  return iVar19;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive 
  ** "checkpoint" lock on the database file. */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  if( rc ){
    /* EVIDENCE-OF: R-10421-19736 If any other process is running a
    ** checkpoint operation at the same time, the lock cannot be obtained and
    ** SQLITE_BUSY is returned.
    ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
    ** it will not be invoked in this case.
    */
    testcase( rc==SQLITE_BUSY );
    testcase( xBusy!=0 );
    return rc;
  }
  pWal->ckptLock = 1;

  /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
  ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
  ** file.
  **
  ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
  ** immediately, and a busy-handler is configured, it is invoked and the
  ** writer lock retried until either the busy-handler returns 0 or the
  ** lock is successfully obtained.
  */
  if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
    rc = walBusyLock(pWal, xBusy, pBusyArg, WAL_WRITE_LOCK, 1);
    if( rc==SQLITE_OK ){
      pWal->writeLock = 1;
    }else if( rc==SQLITE_BUSY ){
      eMode2 = SQLITE_CHECKPOINT_PASSIVE;
      xBusy2 = 0;
      rc = SQLITE_OK;
    }
  }

  /* Read the wal-index header. */
  if( rc==SQLITE_OK ){
    rc = walIndexReadHdr(pWal, &isChanged);
    if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
      sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
    }
  }

  /* Copy data from the log to the database file. */
  if( rc==SQLITE_OK ){

    if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags, zBuf);
    }

    /* If no error occurred, set the output variables. */
    if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
      if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
      if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
    }
  }

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was 
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
  pWal->ckptLock = 0;
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}